

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O3

void __thiscall OrMeaning::Dump(OrMeaning *this,ostream *out)

{
  pointer ppSVar1;
  Activation *pAVar2;
  pointer ppSVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(meaning-or ",0xc);
  ppSVar3 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppSVar3 == ppSVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
      return;
    }
    if ((*ppSVar3)->kind != MEANING) break;
    pAVar2 = ((*ppSVar3)->field_1).activation;
    (*(code *)(pAVar2->parent->field_1).symbol_value)(pAVar2,out);
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    ppSVar3 = ppSVar3 + 1;
  }
  __assert_fail("b->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0x176,"virtual void OrMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    out << "(meaning-or ";
    for (Sexp *b : arguments) {
      assert(b->IsMeaning());
      b->meaning->Dump(out);
      out << " ";
    }

    out << ")";
  }